

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O2

bool __thiscall ninx::lexer::Reader::ignore_comment(Reader *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::istream::peek();
  if (iVar1 == 0x2f) {
    std::istream::get();
    iVar1 = std::istream::peek();
    if (iVar1 == 0x2a) {
      std::istream::get();
      bVar2 = false;
      do {
        while( true ) {
          if (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) != 0)
          goto LAB_0012c9d5;
          iVar1 = std::istream::get();
          if (bVar2) break;
          bVar2 = iVar1 == 0x2a;
        }
        bVar2 = false;
      } while (iVar1 != 0x2f);
LAB_0012c9d5:
      ignore_spaces_and_newline(this);
      return true;
    }
    std::istream::seekg((long)this->stream,~_S_beg);
  }
  return false;
}

Assistant:

bool ninx::lexer::Reader::ignore_comment() {
    // Verify that this is a comment
    if (this->stream.peek() != '/') {
        return false;  // Not a comment
    }

    this->stream.get();

    if (this->stream.peek() != '*') {
        this->stream.seekg(-1, std::ios_base::cur);  // Rewind the / character
        return false;
    }

    this->stream.get();

    bool is_closing {false};

    while (stream) {
        int current {stream.get()};

        if (is_closing) {
            if (current == '/') {
                break;
            }else{
                is_closing = false;
            }
        }else{
            if (current == '*') {
                is_closing = true;
            }
        }
    }

    // Eat all the following spaces
    this->ignore_spaces_and_newline();

    return true;
}